

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O3

Ptr<ImageView> __thiscall
myvk::ImageView::Create(ImageView *this,Ptr<SwapchainImage> *swapchain_image)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ptr<ImageView> PVar3;
  Ptr<ImageBase> local_28;
  VkComponentMapping local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((swapchain_image->super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->super_ImageBase;
  local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (swapchain_image->super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  peVar1 = (element_type *)
           local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      peVar1 = (swapchain_image->
               super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_18.r = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_18.g = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_18.b = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_18.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  PVar3 = Create(this,&local_28,VK_IMAGE_VIEW_TYPE_2D,
                 (((peVar1->m_swapchain_ptr).
                   super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_swapchain_create_info).imageFormat,1,0,1,0,1,&local_18);
  _Var2 = PVar3.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX;
  }
  PVar3.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ImageView>)PVar3.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<SwapchainImage> &swapchain_image) {
	return Create(swapchain_image, VK_IMAGE_VIEW_TYPE_2D, swapchain_image->GetSwapchainPtr()->GetImageFormat(),
	              VK_IMAGE_ASPECT_COLOR_BIT);
}